

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

shared_ptr<slang::syntax::SyntaxTree>
slang::syntax::SyntaxTree::fromLibraryMapFile
          (string_view path,SourceManager *sourceManager,Bag *options)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<slang::syntax::SyntaxTree> sVar2;
  BufferOrError buffer;
  Bag *in_stack_00000878;
  SourceManager *in_stack_00000880;
  SourceBuffer *in_stack_00000888;
  nullptr_t in_stack_ffffffffffffff48;
  path *in_stack_ffffffffffffff50;
  undefined1 *sortKey;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  path *in_stack_ffffffffffffff80;
  SourceManager *in_stack_ffffffffffffff88;
  format in_stack_ffffffffffffff97;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  path *in_stack_ffffffffffffffa0;
  
  sortKey = &stack0xffffffffffffff88;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff97);
  SourceManager::readSource
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (SourceLibrary *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (uint64_t)sortKey);
  std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffff50);
  bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                    ((expected<slang::SourceBuffer,_std::error_code> *)0x2d39aa);
  if (bVar1) {
    in_stack_ffffffffffffff50 =
         (path *)nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::operator*
                           ((expected<slang::SourceBuffer,_std::error_code> *)0x2d39ea);
    fromLibraryMapBuffer(in_stack_00000888,in_stack_00000880,in_stack_00000878);
  }
  else {
    std::shared_ptr<slang::syntax::SyntaxTree>::shared_ptr
              ((shared_ptr<slang::syntax::SyntaxTree> *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
  }
  nonstd::expected_lite::expected<slang::SourceBuffer,_std::error_code>::~expected
            ((expected<slang::SourceBuffer,_std::error_code> *)in_stack_ffffffffffffff50);
  sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar2.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> SyntaxTree::fromLibraryMapFile(std::string_view path,
                                                           SourceManager& sourceManager,
                                                           const Bag& options) {
    auto buffer = sourceManager.readSource(path, /* library */ nullptr);
    if (!buffer)
        return nullptr;

    return fromLibraryMapBuffer(*buffer, sourceManager, options);
}